

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

x86_reg X86_insn_reg_att(uint id)

{
  uint local_14;
  uint i;
  uint id_local;
  
  local_14 = 0;
  while( true ) {
    if (0x60 < local_14) {
      return X86_REG_INVALID;
    }
    if (insn_regs_att[local_14].insn == id) break;
    local_14 = local_14 + 1;
  }
  return insn_regs_att[local_14].reg;
}

Assistant:

x86_reg X86_insn_reg_att(unsigned int id)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_att); i++) {
		if (insn_regs_att[i].insn == id) {
			return insn_regs_att[i].reg;
		}
	}

	// not found
	return 0;
}